

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int cvsrch(custom_function *funcpt,custom_gradient *funcgrad,double *x,double *f,double *g,
          double *stp,double *s,int N,double *dx,double maxstep,int MAXITER,double eps2,double ftol,
          double gtol,double xtol)

{
  double *array;
  void *__ptr;
  double dVar1;
  double dVar2;
  double dVar3;
  double *wa;
  double *rcheck;
  double stepmin;
  double rell;
  double den;
  double nlen;
  double xtrapf;
  double width1;
  double width;
  double stmax;
  double stmin;
  double sty;
  double stx;
  double p66;
  double p5;
  double fym;
  double fy;
  double fxm;
  double fx;
  double fm;
  double ftest1;
  double finit;
  double dgym;
  double dgy;
  double dgxm;
  double dgx;
  double dgtest;
  double dginit;
  double dgm;
  double dg;
  int stage1;
  int brackt;
  int j;
  int infoc;
  int nfev;
  int siter;
  int i;
  int info;
  double xtol_local;
  double gtol_local;
  double ftol_local;
  double eps2_local;
  double maxstep_local;
  double *stp_local;
  double *g_local;
  double *f_local;
  double *x_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  _i = xtol;
  xtol_local = gtol;
  gtol_local = ftol;
  ftol_local = eps2;
  eps2_local = maxstep;
  maxstep_local = (double)stp;
  stp_local = g;
  g_local = f;
  f_local = x;
  x_local = (double *)funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  array = (double *)malloc((long)N << 3);
  __ptr = malloc((long)N << 3);
  den = 0.0;
  p66 = 0.5;
  stx = 0.66;
  siter = 0;
  brackt = 1;
  infoc = MAXITER;
  if ((((N < 1) || (*(double *)maxstep_local <= 0.0)) || (gtol_local < 0.0)) ||
     ((xtol_local < 0.0 || (_i < 0.0)))) {
    free(array);
    free(__ptr);
    funcpt_local._4_4_ = siter;
  }
  else {
    for (nfev = 0; nfev < N; nfev = nfev + 1) {
      den = dx[nfev] * s[nfev] * dx[nfev] * s[nfev] + den;
    }
    sqrt(den);
    for (nfev = 0; nfev < N; nfev = nfev + 1) {
      if (ABS(f_local[nfev]) <= 1.0 / ABS(dx[nfev])) {
        rell = 1.0 / ABS(dx[nfev]);
      }
      else {
        rell = ABS(f_local[nfev]);
      }
      array[nfev] = s[nfev] / rell;
    }
    dVar1 = array_max_abs(array,N);
    dVar1 = gtol_local / dVar1;
    dgtest = 0.0;
    for (stage1 = 0; stage1 < N; stage1 = stage1 + 1) {
      dgtest = stp_local[stage1] * s[stage1] + dgtest;
    }
    if (dgtest < 0.0) {
      dg._4_4_ = 0;
      dg._0_4_ = 1;
      fym = *g_local;
      j = 0;
      dgx = gtol_local * dgtest;
      width1 = eps2_local - dVar1;
      xtrapf = width1 / 0.5;
      for (stage1 = 0; stage1 < N; stage1 = stage1 + 1) {
        *(double *)((long)__ptr + (long)stage1 * 8) = f_local[stage1];
      }
      sty = 0.0;
      dgxm = dgtest;
      stmin = 0.0;
      dgym = dgtest;
      fxm = fym;
      ftest1 = fym;
      while (siter == 0) {
        if (dg._4_4_ == 1) {
          stmax = pmin(sty,stmin);
          width = pmax(sty,stmin);
        }
        else {
          stmax = sty;
          width = (*(double *)maxstep_local - sty) * 4.0 + *(double *)maxstep_local;
        }
        dVar2 = pmax(*(double *)maxstep_local,dVar1);
        *(double *)maxstep_local = dVar2;
        dVar2 = pmin(*(double *)maxstep_local,eps2_local);
        *(double *)maxstep_local = dVar2;
        if ((((dg._4_4_ == 1) &&
             ((*(double *)maxstep_local <= stmax || (width <= *(double *)maxstep_local)))) ||
            (infoc + -1 <= j)) ||
           ((brackt == 0 || ((dg._4_4_ == 1 && (width - stmax <= _i * width)))))) {
          *(double *)maxstep_local = sty;
        }
        for (stage1 = 0; stage1 < N; stage1 = stage1 + 1) {
          f_local[stage1] =
               *(double *)maxstep_local * s[stage1] + *(double *)((long)__ptr + (long)stage1 * 8);
        }
        dVar2 = (double)(*funcgrad_local->funcgrad)
                                  (f_local,N,(double *)funcgrad_local->params,funcgrad_local);
        *g_local = dVar2;
        if ((1.79769313486232e+308 <= *g_local) || (*g_local <= -1.79769313486232e+308)) {
          printf("Program Exiting as the function value exceeds the maximum double value");
          free(array);
          free(__ptr);
          return 0xf;
        }
        if ((*g_local != *g_local) || (NAN(*g_local) || NAN(*g_local))) {
          printf("Program Exiting as the function returns NaN");
          free(array);
          free(__ptr);
          return 0xf;
        }
        grad_cd((custom_function *)funcgrad_local,(custom_gradient *)x_local,f_local,N,dx,ftol_local
                ,stp_local);
        j = j + 1;
        dgm = 0.0;
        for (stage1 = 0; dVar2 = dgm, stage1 < N; stage1 = stage1 + 1) {
          dgm = stp_local[stage1] * s[stage1] + dgm;
        }
        fm = *(double *)maxstep_local * dgx + ftest1;
        if (((dg._4_4_ == 1) &&
            ((*(double *)maxstep_local <= stmax || (width <= *(double *)maxstep_local)))) ||
           (brackt == 0)) {
          siter = 6;
        }
        if ((((*(double *)maxstep_local == eps2_local) &&
             (!NAN(*(double *)maxstep_local) && !NAN(eps2_local))) && (*g_local <= fm)) &&
           (dgm <= dgx)) {
          siter = 5;
        }
        if (((*(double *)maxstep_local == dVar1) && (!NAN(*(double *)maxstep_local) && !NAN(dVar1)))
           && ((fm < *g_local || (dgx <= dgm)))) {
          siter = 4;
        }
        if (infoc <= j) {
          siter = 3;
        }
        if ((dg._4_4_ == 1) && (width - stmax <= _i * width)) {
          siter = 2;
        }
        if ((*g_local <= fm) && (ABS(dgm) <= xtol_local * -dgtest)) {
          siter = 1;
        }
        if (((dg._0_4_ == 1) && (*g_local <= fm)) &&
           (dVar3 = pmin(gtol_local,xtol_local), dVar3 * dgtest <= dVar2)) {
          dg._0_4_ = 0;
        }
        if (((dg._0_4_ != 1) || (fxm < *g_local)) || (*g_local <= fm)) {
          brackt = cstep(&sty,&fxm,&dgxm,&stmin,&fym,&dgym,(double *)maxstep_local,g_local,&dgm,
                         (int *)((long)&dg + 4),stmax,width);
        }
        else {
          fx = -*(double *)maxstep_local * dgx + *g_local;
          fy = -sty * dgx + fxm;
          p5 = -stmin * dgx + fym;
          dginit = dgm - dgx;
          dgy = dgxm - dgx;
          finit = dgym - dgx;
          brackt = cstep(&sty,&fy,&dgy,&stmin,&p5,&finit,(double *)maxstep_local,&fx,&dginit,
                         (int *)((long)&dg + 4),stmax,width);
          fxm = sty * dgx + fy;
          fym = stmin * dgx + p5;
          dgxm = dgy + dgx;
          dgym = finit + dgx;
        }
        if (dg._4_4_ == 1) {
          if (stx * xtrapf <= ABS(stmin - sty)) {
            *(double *)maxstep_local = p66 * (stmin - sty) + sty;
          }
          xtrapf = width1;
          width1 = ABS(stmin - sty);
        }
      }
      free(array);
      free(__ptr);
      funcpt_local._4_4_ = siter;
    }
    else {
      free(array);
      free(__ptr);
      funcpt_local._4_4_ = siter;
    }
  }
  return funcpt_local._4_4_;
}

Assistant:

int cvsrch(custom_function *funcpt, custom_gradient *funcgrad, double *x, double *f, double *g, double *stp, double *s, int N, double *dx, double maxstep,
	int MAXITER,double eps2,double ftol, double gtol, double xtol) {
	int info,i,siter,nfev;
	int infoc, j, brackt, stage1;
	double dg, dgm, dginit, dgtest, dgx, dgxm, dgy, dgym, finit, ftest1, fm, fx, fxm, fy, fym, p5, p66, stx, sty,
		stmin, stmax, width, width1, xtrapf;
	double nlen,den,rell,stepmin;
	double *rcheck,*wa;

	rcheck = (double*)malloc(sizeof(double)*N);
	wa = (double*)malloc(sizeof(double)*N);

	nlen = 0.0;
	p5 = 0.5;
	p66 = 0.66;
	xtrapf = 4.0;
	info = 0;
	infoc = 1;
	siter = MAXITER;


	if (N <= 0 || *stp <= 0.0 || ftol < 0.0 || gtol < 0.0 || xtol < 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}


	for (i = 0; i < N; ++i) {
		nlen += dx[i] * s[i] * dx[i] * s[i];
	}
	nlen = sqrt(nlen);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) > 1.0 / fabs(dx[i])) {
			den = fabs(x[i]);
		}
		else {
			den = 1.0 / fabs(dx[i]);
		}
		rcheck[i] = s[i] / den;
	}

	rell = array_max_abs(rcheck, N);

	stepmin = ftol / rell;

	dginit = 0.0;

	for (j = 0; j < N; ++j) {
		dginit += g[j] * s[j];
	}

	if (dginit >= 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}

	brackt = 0;
	stage1 = 1;
	finit = *f;
	nfev = 0;
	dgtest = ftol*dginit;
	width = maxstep - stepmin;
	width1 = width / 0.5;

	for (j = 0; j < N; ++j) {
		wa[j] = x[j];
	}

	/*     The variables stx, fx, dgx contain the values of the step, 
     function, and directional derivative at the best step.
     The variables sty, fy, dgy contain the value of the step,
     function, and derivative at the other endpoint of
     the interval of uncertainty.
     The variables stp, f, dg contain the values of the step,
     function, and derivative at the current step.
	*/

	stx = 0.0;
	fx = finit;
	dgx = dginit;
	sty = 0.0;
	fy = finit;
	dgy = dginit;

	// Iteration

	while (info == 0) {

		if (brackt == 1) {
			stmin = pmin(stx, sty);
			stmax = pmax(stx, sty);
		} else {
			stmin = stx;
			stmax = *stp + xtrapf*(*stp - stx);
		}

		*stp = pmax(*stp, stepmin);
		*stp = pmin(*stp, maxstep);

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || nfev >= siter - 1 || infoc == 0 || (brackt == 1 && (stmax - stmin) <= xtol*stmax)) {
			*stp = stx;
		}

		for (j = 0; j < N; ++j) {
			x[j] = wa[j] + *stp * s[j];
		}

		*f = FUNCPT_EVAL(funcpt,x, N);
		if (*f >= DBL_MAX || *f <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(rcheck);
			free(wa);
			return 15;
		}
		if (*f != *f) {
			printf("Program Exiting as the function returns NaN");
			free(rcheck);
			free(wa);
			return 15;
		}
		grad_cd(funcpt,funcgrad, x, N, dx, eps2,g);
		nfev++;


		dg = 0.0;
		for (j = 0; j < N; ++j) {
			dg = dg + g[j]*s[j];
		}	
		ftest1 = finit + *stp * dgtest;

		//       Test for convergence.

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || infoc == 0) {
			info = 6;
		}

		if (*stp == maxstep && *f <= ftest1 && dg <= dgtest) {
			info = 5;
		}

		if (*stp == stepmin && (*f > ftest1 || dg >= dgtest)) {
			info = 4;
		}

		if (nfev >= siter) {
			info = 3;
		}

		if (brackt == 1 && ((stmax - stmin) <= xtol*stmax)) {
			info = 2;
		}

		if (*f <= ftest1 && fabs(dg) <= gtol*(-dginit)) {
			info = 1;
		}

		if (stage1 == 1 && *f <= ftest1 && dg >= pmin(ftol, gtol)*dginit) {
			stage1 = 0;
		}


		/*
		A modified function is used to predict the step only if
        we have not obtained a step for which the modified
        function has a nonpositive function value and nonnegative
        derivative, and if a lower function value has been
        obtained but the decrease is not sufficient.
		*/
		if (stage1 == 1 && *f <= fx && *f > ftest1) {

			fm = *f - *stp*dgtest;
			fxm = fx - stx*dgtest;
			fym = fy - sty*dgtest;
			dgm = dg - dgtest;
			dgxm = dgx - dgtest;
			dgym = dgy - dgtest;

			infoc = cstep(&stx, &fxm, &dgxm, &sty, &fym, &dgym, stp, &fm, &dgm, &brackt, stmin, stmax);

			fx = fxm + stx*dgtest;
			fy = fym + sty*dgtest;
			dgx = dgxm + dgtest;
			dgy = dgym + dgtest;
		} else {
			
			infoc = cstep(&stx, &fx, &dgx, &sty, &fy, &dgy, stp, f, &dg, &brackt, stmin, stmax);
		}

		if (brackt == 1) {
			if (fabs(sty - stx) >= p66*width1) {
				*stp = stx + p5*(sty - stx);
			}
			width1 = width;
			width = fabs(sty - stx);
		}

	}

	free(rcheck);
	free(wa);

	return info;
}